

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

ImVec2 __thiscall BoardView::ScreenToCoord(BoardView *this,float x,float y,float w)

{
  int iVar1;
  long in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float invscale;
  float side;
  float ty;
  float tx;
  float local_24;
  float local_20;
  ImVec2 local_8;
  
  iVar1 = *(int *)(in_RDI + 0xd5d8);
  local_24 = in_XMM1_Da;
  local_20 = in_XMM0_Da;
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      local_24 = -in_XMM0_Da;
      local_20 = in_XMM1_Da;
    }
    else if (iVar1 == 2) {
      local_20 = -in_XMM0_Da;
      local_24 = -in_XMM1_Da;
    }
    else {
      local_20 = -in_XMM1_Da;
      local_24 = in_XMM0_Da;
    }
  }
  fVar2 = 1.0 / *(float *)(in_RDI + 0xd5c8);
  ImVec2::ImVec2(&local_8,local_20 *
                          *(float *)(&DAT_002a76a0 + (ulong)(*(int *)(in_RDI + 0xd5dc) != 0) * 4) *
                          fVar2 + in_XMM2_Da *
                                  (*(float *)(in_RDI + 0xd5c0) - *(float *)(in_RDI + 0xd5b8)),
                 in_XMM2_Da * (*(float *)(in_RDI + 0xd5c4) - *(float *)(in_RDI + 0xd5bc)) -
                 local_24 * fVar2);
  return local_8;
}

Assistant:

ImVec2 BoardView::ScreenToCoord(float x, float y, float w) {
	float tx, ty;

	switch (m_rotation) {
		case 0:
			tx = x;
			ty = y;
			break;
		case 1:
			tx = y;
			ty = -x;
			break;
		case 2:
			tx = -x;
			ty = -y;
			break;
		default:
			tx = -y;
			ty = x;
			break;
	}
	float side     = m_current_side ? -1.0f : 1.0f;
	float invscale = 1.0f / m_scale;

	tx = tx * side * invscale + w * (m_mx - m_dx);
	ty = ty * -1.0f * invscale + w * (m_my - m_dy);

	return ImVec2(tx, ty);
}